

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1491_avgSalary.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> salary;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_18 [4];
  
  local_18[0] = 1000;
  local_18[1] = 2000;
  local_18[2] = 3000;
  local_18[3] = 4000;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_31);
  dVar1 = average(&local_30);
  std::ostream::_M_insert<double>(dVar1);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
	vector<int> salary = {1000,2000,3000,4000};
	cout<<average(salary);
	return 0;
}